

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O2

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenString(Lexer *this)

{
  int iVar1;
  Lexer *in_RSI;
  undefined2 local_6a;
  unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
  local_68;
  undefined1 local_5c [28];
  Position local_40;
  
  while( true ) {
    nextChar(in_RSI);
    iVar1 = in_RSI->currentChar;
    if (iVar1 == -1) break;
    if (iVar1 == 0x22) {
      nextChar(in_RSI);
      local_5c._4_2_ = 0x11;
      getCurrentCursor(&local_40,in_RSI);
      std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
                ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)(local_5c + 4));
      return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
             (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
    }
    if ((in_RSI->cfg).multiLineString == false) {
      if (iVar1 == 0x5c) goto LAB_00108c6f;
      if ((iVar1 == 10) || (iVar1 == 0xd)) break;
    }
    else if (iVar1 == 0x5c) {
LAB_00108c6f:
      nextTokenStringEscapeCode(this);
      if (this->_vptr_Lexer != (_func_int **)0x0) {
        return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
               (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
               this;
      }
      std::unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_>::~unique_ptr
                ((unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> *)this);
    }
  }
  local_6a = LEX_ERR_ID_NOT_JUST_ANYS;
  local_5c._0_4_ = 5;
  getCurrentCursor((Position *)(local_5c + 4),in_RSI);
  local_40.startIndex = in_RSI->currentEndIndex;
  local_40.endIndex = local_40.startIndex;
  std::
  make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
            ((Level *)&local_68,(LexerErrorCode *)&local_6a,(Position *)local_5c);
  generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                      *)in_RSI);
  std::
  unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
  ::~unique_ptr(&local_68);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenString() noexcept {
  nextChar(); // eat "

  while (currentChar != '\"' && currentChar != EOF
      && (cfg.multiLineString || (currentChar != '\r' && currentChar != '\n'))) {
    if (currentChar == '\\') {
      std::unique_ptr<Token> tok(nextTokenStringEscapeCode());
      if (tok)
        return tok; // error forwarding
    }

    nextChar();
  }

  if (currentChar != '\"')
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_STR_INVALID_END, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));

  nextChar(); // eat "

  return std::make_unique<Token>(currentToken, TokenType::TOK_STR, getCurrentCursor());
}